

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Point2f __thiscall pbrt::CylindricalMapping2D::cylinder(CylindricalMapping2D *this,Point3f *p)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Point3<float> PVar6;
  Vector3<float> VVar7;
  Tuple3<pbrt::Vector3,_float> local_10;
  
  auVar5 = in_ZMM0._8_56_;
  PVar6 = Transform::operator()(&this->textureFromRender,p);
  local_10.z = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  local_10._0_8_ = vmovlps_avx(auVar3._0_16_);
  VVar7 = Normalize<float>((Vector3<float> *)&local_10);
  auVar4._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  auVar1 = vmovshdup_avx(auVar4._0_16_);
  fVar2 = atan2f(auVar1._0_4_,VVar7.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar1 = vinsertps_avx(ZEXT416((uint)((fVar2 + 3.1415927) * 0.15915494)),
                         ZEXT416((uint)VVar7.super_Tuple3<pbrt::Vector3,_float>.z),0x10);
  return (Point2f)auVar1._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f cylinder(const Point3f &p) const {
        Vector3f vec = Normalize(textureFromRender(p) - Point3f(0, 0, 0));
        return Point2f((Pi + std::atan2(vec.y, vec.x)) * Inv2Pi, vec.z);
    }